

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O0

void decode_nvrm_ioctl_create_dev_obj(nvrm_ioctl_create_dev_obj *s)

{
  int iVar1;
  nvrm_ioctl_create_dev_obj *s_local;
  
  if ((s->cid != 0) || (iVar1 = _nvrm_field_enabled("cid"), iVar1 != 0)) {
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->handle != 0) || (iVar1 = _nvrm_field_enabled("handle"), iVar1 != 0)) {
    if ((s->handle != 0) || (iVar1 = _nvrm_field_enabled("handle"), iVar1 != 0)) {
      fprintf(_stdout,"%shandle: 0x%08x",nvrm_pfx,(ulong)s->handle);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  if ((s->unk08 != 0) || (iVar1 = _nvrm_field_enabled("unk08"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk08: 0x%08x",nvrm_pfx,(ulong)s->unk08);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->unk0c != 0) || (iVar1 = _nvrm_field_enabled("unk0c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk0c: 0x%08x",nvrm_pfx,(ulong)s->unk0c);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->ptr != 0) || (iVar1 = _nvrm_field_enabled("ptr"), iVar1 != 0)) {
    fprintf(_stdout,"%sptr: 0x%08x",nvrm_pfx,(ulong)s->ptr);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->unk14 != 0) || (iVar1 = _nvrm_field_enabled("unk14"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk14: 0x%08x",nvrm_pfx,(ulong)s->unk14);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->unk18 != 0) || (iVar1 = _nvrm_field_enabled("unk18"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk18: 0x%08x",nvrm_pfx,(ulong)s->unk18);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->unk1c != 0) || (iVar1 = _nvrm_field_enabled("unk1c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk1c: 0x%08x",nvrm_pfx,(ulong)s->unk1c);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_dev_obj(struct nvrm_ioctl_create_dev_obj *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_x32(s, unk08);
	nvrm_print_x32(s, unk0c);
	nvrm_print_x32(s, ptr);
	nvrm_print_x32(s, unk14);
	nvrm_print_x32(s, unk18);
	nvrm_print_x32(s, unk1c);
	nvrm_print_ln();
}